

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O1

void Aig_RManQuit(void)

{
  char Buffer [20];
  char acStack_28 [32];
  
  if (s_pRMan != (Aig_RMan_t *)0x0) {
    sprintf(acStack_28,"aiglib%02d.aig",(ulong)(uint)s_pRMan->nVars);
    Ioa_WriteAiger(s_pRMan->pAig,acStack_28,0,1);
    Aig_RManStop(s_pRMan);
    s_pRMan = (Aig_RMan_t *)0x0;
  }
  return;
}

Assistant:

void Aig_RManQuit()
{
//    extern void Ioa_WriteAiger( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact );
    char Buffer[20];
    if ( s_pRMan == NULL )
        return;
    // dump the library file
    sprintf( Buffer, "aiglib%02d.aig", s_pRMan->nVars );
    Ioa_WriteAiger( s_pRMan->pAig, Buffer, 0, 1 );
    // quit the manager
    Aig_RManStop( s_pRMan );
    s_pRMan = NULL;
}